

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddFieldByNumber
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  bool bVar1;
  FieldDescriptor *in_RSI;
  DescriptorIntPair key;
  int local_2c;
  Descriptor *local_28;
  Descriptor *in_stack_ffffffffffffffe0;
  first_type *in_stack_ffffffffffffffe8;
  
  local_28 = FieldDescriptor::containing_type(in_RSI);
  local_2c = FieldDescriptor::number(in_RSI);
  std::pair<const_google::protobuf::Descriptor_*,_int>::
  pair<const_google::protobuf::Descriptor_*,_int,_true>
            ((pair<const_google::protobuf::Descriptor_*,_int> *)&stack0xffffffffffffffe0,&local_28,
             &local_2c);
  bVar1 = InsertIfNotPresent<std::unordered_map<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::Descriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>>>
                    ((unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                      *)in_RSI,in_stack_ffffffffffffffe8,(second_type *)in_stack_ffffffffffffffe0);
  return bVar1;
}

Assistant:

bool FileDescriptorTables::AddFieldByNumber(const FieldDescriptor* field) {
  DescriptorIntPair key(field->containing_type(), field->number());
  return InsertIfNotPresent(&fields_by_number_, key, field);
}